

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

void opt_j(opt_state_t *opt_state,edge *ep)

{
  block *pbVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  block *pbVar8;
  ulong uVar9;
  
  pbVar8 = ep->succ;
  pbVar1 = (pbVar8->et).succ;
  if (pbVar1 != (block *)0x0) {
    if ((pbVar1 == (pbVar8->ef).succ) && (iVar4 = use_conflict(ep->pred,pbVar1), iVar4 == 0)) {
      opt_state->done = 0;
      ep->succ = pbVar1;
      pbVar8 = pbVar1;
    }
    uVar3 = opt_state->edgewords;
    if (opt_state->edgewords < 1) {
      uVar3 = 0;
    }
LAB_00112e05:
    for (uVar9 = 0; uVar9 != uVar3; uVar9 = uVar9 + 1) {
      uVar7 = ep->edom[uVar9];
LAB_00112e26:
      if (uVar7 != 0) {
        uVar2 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar7 = uVar7 & ~(1 << (uVar2 & 0x1f));
        iVar4 = opt_state->edges[(int)(uVar2 | (int)uVar9 << 5)]->code;
        iVar5 = -iVar4;
        if (0 < iVar4) {
          iVar5 = iVar4;
        }
        if (((pbVar8->s).code == iVar5) &&
           (pbVar1 = opt_state->edges[(int)(uVar2 | (int)uVar9 << 5)]->pred,
           pbVar8->val[0x10] == pbVar1->val[0x10])) {
          if (pbVar8->oval == pbVar1->oval) {
            lVar6 = 0x58;
            if (iVar4 < 0) {
              lVar6 = 0x80;
            }
          }
          else {
            lVar6 = 0x80;
            if (iVar5 != 0x15 || iVar4 < 0) goto LAB_00112e26;
          }
          pbVar1 = *(block **)((long)&pbVar8->id + lVar6);
          if ((pbVar1 != (block *)0x0) && (iVar4 = use_conflict(ep->pred,pbVar1), iVar4 == 0)) {
            opt_state->done = 0;
            ep->succ = pbVar1;
            pbVar8 = pbVar1;
            if ((pbVar1->et).succ == (block *)0x0) {
              return;
            }
            goto LAB_00112e05;
          }
        }
        goto LAB_00112e26;
      }
    }
  }
  return;
}

Assistant:

static void
opt_j(opt_state_t *opt_state, struct edge *ep)
{
	register int i, k;
	register struct block *target;

	if (JT(ep->succ) == 0)
		return;

	if (JT(ep->succ) == JF(ep->succ)) {
		/*
		 * Common branch targets can be eliminated, provided
		 * there is no data dependency.
		 */
		if (!use_conflict(ep->pred, ep->succ->et.succ)) {
			opt_state->done = 0;
			ep->succ = JT(ep->succ);
		}
	}
	/*
	 * For each edge dominator that matches the successor of this
	 * edge, promote the edge successor to the its grandchild.
	 *
	 * XXX We violate the set abstraction here in favor a reasonably
	 * efficient loop.
	 */
 top:
	for (i = 0; i < opt_state->edgewords; ++i) {
		register bpf_u_int32 x = ep->edom[i];

		while (x != 0) {
			k = ffs(x) - 1;
			x &=~ (1 << k);
			k += i * BITS_PER_WORD;

			target = fold_edge(ep->succ, opt_state->edges[k]);
			/*
			 * Check that there is no data dependency between
			 * nodes that will be violated if we move the edge.
			 */
			if (target != 0 && !use_conflict(ep->pred, target)) {
				opt_state->done = 0;
				ep->succ = target;
				if (JT(target) != 0)
					/*
					 * Start over unless we hit a leaf.
					 */
					goto top;
				return;
			}
		}
	}
}